

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Poppifier::emitLocalGet(Poppifier *this,LocalGet *curr)

{
  Index index;
  ulong uVar1;
  Type this_00;
  bool bVar2;
  reference pvVar3;
  size_t sVar4;
  const_reference pvVar5;
  Type *pTVar6;
  LocalGet *local_50;
  uintptr_t local_48;
  LocalGet *local_40;
  ulong local_38;
  size_t i;
  mapped_type *elems;
  Type types;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  LocalGet *curr_local;
  Poppifier *this_local;
  
  pvVar3 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  types.id = (uintptr_t)&pvVar3->instrs;
  bVar2 = wasm::Type::isTuple(&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                               super_Expression.type);
  if (bVar2) {
    elems = (mapped_type *)
            Function::getLocalType
                      ((this->super_BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>).func,
                       curr->index);
    i = (size_t)std::
                unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[](&this->tupleVars,&curr->index);
    for (local_38 = 0; uVar1 = local_38, sVar4 = wasm::Type::size((Type *)&elems), this_00 = types,
        uVar1 < sVar4; local_38 = local_38 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i,local_38);
      index = *pvVar5;
      pTVar6 = wasm::Type::operator[]((Type *)&elems,local_38);
      local_48 = pTVar6->id;
      local_40 = Builder::makeLocalGet(&this->builder,index,(Type)local_48);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00.id,
                 (value_type *)&local_40);
    }
  }
  else {
    local_50 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)types.id,
               (value_type *)&local_50);
  }
  return;
}

Assistant:

void Poppifier::emitLocalGet(LocalGet* curr) {
  auto& instrs = scopeStack.back().instrs;
  if (curr->type.isTuple()) {
    auto types = func->getLocalType(curr->index);
    const auto& elems = tupleVars[curr->index];
    for (size_t i = 0; i < types.size(); ++i) {
      instrs.push_back(builder.makeLocalGet(elems[i], types[i]));
    }
  } else {
    instrs.push_back(curr);
  }
}